

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O2

void __thiscall
optimization::inlineFunc::Rewriter::Rewriter
          (Rewriter *this,MirFunction *func,MirFunction *subfunc,CallInst *callInst,int cur_blkId)

{
  _Rb_tree_header *p_Var1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar2;
  char *pcVar3;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *this_00;
  pointer pVVar4;
  Rewriter *pRVar5;
  _Self __tmp_1;
  _Rb_tree_node_base *p_Var6;
  long lVar7;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *this_01;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar8;
  uint32_t *puVar9;
  mapped_type *pmVar10;
  mapped_type *this_02;
  size_type sVar11;
  Variable *this_03;
  size_type sVar12;
  mapped_type *pmVar13;
  _Base_ptr p_Var14;
  uint32_t uVar15;
  variant<int,_mir::inst::VarId> *__v;
  _Self __tmp;
  int iVar16;
  ulong uVar17;
  uint32_t new_id;
  undefined4 uStack_b4;
  int ret;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_a8;
  Rewriter *local_a0;
  VarId destId;
  int imm;
  VarId destId_1;
  
  this->func = func;
  this->subfunc = subfunc;
  p_Var1 = &(this->var_cast_map)._M_t._M_impl.super__Rb_tree_header;
  (this->var_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->var_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->var_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->var_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->var_cast_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->label_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->label_cast_map)._M_t._M_impl.super__Rb_tree_header;
  (this->label_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->label_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->label_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->label_cast_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->init_inst_before).
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->init_inst_before).
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->init_inst_before).
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->init_inst_after).
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->init_inst_after).
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->init_inst_after).
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->cur_blkId = cur_blkId;
  this->Inline_Var_Priority = 0;
  p_Var6 = &(func->variables)._M_t._M_impl.super__Rb_tree_header._M_header;
  do {
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var6);
  } while (1000000 < p_Var6[1]._M_color);
  pmVar2 = &this->var_cast_map;
  local_a8 = &this->label_cast_map;
  this_00 = &func->variables;
  this->varId = p_Var6[1]._M_color;
  p_Var6 = (_Rb_tree_node_base *)
           std::_Rb_tree_decrement(&(func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header)
  ;
  lVar7 = std::_Rb_tree_decrement(p_Var6);
  this->labelId = *(int *)(lVar7 + 0x20);
  this_01 = &subfunc->variables;
  lVar7 = 0x18;
  local_a0 = this;
  for (uVar17 = 0;
      pVVar4 = (callInst->params).
               super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar17 < (ulong)((long)(callInst->params).
                             super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4 >> 5);
      uVar17 = uVar17 + 1) {
    ret = (int)uVar17 + 1;
    pcVar3 = (char *)((long)&(pVVar4->super_Displayable)._vptr_Displayable + lVar7);
    __v = (variant<int,_mir::inst::VarId> *)(pcVar3 + -0x10);
    if (*pcVar3 == '\0') {
      std::get<0ul,int,mir::inst::VarId>(__v);
      destId_1.id = local_a0->varId + 1;
      local_a0->varId = destId_1.id;
      destId_1.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
      destId.super_Displayable._vptr_Displayable._0_4_ = ret;
      pmVar10 = std::
                map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                ::at(this_01,(key_type_conflict *)&destId);
      new_id = destId_1.id;
      this_02 = std::
                map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                ::operator[](this_00,&new_id);
      mir::inst::Variable::operator=(this_02,pmVar10);
      iVar16 = local_a0->Inline_Var_Priority;
      destId.super_Displayable._vptr_Displayable._0_4_ = destId_1.id;
      pmVar10 = std::
                map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                ::operator[](this_00,(key_type_conflict *)&destId);
      pmVar10->priority = iVar16;
      std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,int&>
                ((VarId *)&new_id,(int *)&destId_1);
      destId.super_Displayable._vptr_Displayable = (_func_int **)_new_id;
      _new_id = (tuple<mir::inst::AssignInst_*,_std::default_delete<mir::inst::AssignInst>_>)
                (_Tuple_impl<0UL,_mir::inst::AssignInst_*,_std::default_delete<mir::inst::AssignInst>_>
                 )0x0;
      std::
      vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
      ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                  *)&this->init_inst_before,
                 (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)&destId);
      if (destId.super_Displayable._vptr_Displayable != (_func_int **)0x0) {
        (**(code **)(*destId.super_Displayable._vptr_Displayable + 0x28))();
      }
      destId.super_Displayable._vptr_Displayable = (_func_int **)0x0;
      std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
      ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_> *)
                  &new_id);
      uVar15 = destId_1.id;
      puVar9 = (uint32_t *)
               std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](pmVar2,&ret);
    }
    else {
      pvVar8 = std::get<1ul,int,mir::inst::VarId>(__v);
      uVar15 = pvVar8->id;
      puVar9 = (uint32_t *)
               std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](pmVar2,&ret);
    }
    *puVar9 = uVar15;
    lVar7 = lVar7 + 0x20;
  }
  ret = 0;
  uVar15 = local_a0->varId + 1;
  local_a0->varId = uVar15;
  destId.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  destId.id = uVar15;
  puVar9 = (uint32_t *)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](pmVar2,&ret);
  *puVar9 = uVar15;
  destId_1.super_Displayable._vptr_Displayable._0_4_ = ret;
  sVar11 = std::
           map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
           ::count(this_01,(key_type_conflict *)&destId_1);
  if (sVar11 == 0) {
    pmVar10 = std::
              map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
              ::at(this_00,&(callInst->super_Inst).dest.id);
    this_03 = std::
              map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
              ::operator[](this_00,&destId.id);
  }
  else {
    destId_1.super_Displayable._vptr_Displayable._0_4_ = ret;
    pmVar10 = std::
              map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
              ::at(this_01,(key_type_conflict *)&destId_1);
    this_03 = std::
              map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
              ::operator[](this_00,&destId.id);
  }
  mir::inst::Variable::operator=(this_03,pmVar10);
  std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::VarId&>
            ((VarId *)&new_id,&(callInst->super_Inst).dest);
  destId_1.super_Displayable._vptr_Displayable = (_func_int **)_new_id;
  _new_id = (tuple<mir::inst::AssignInst_*,_std::default_delete<mir::inst::AssignInst>_>)
            (_Tuple_impl<0UL,_mir::inst::AssignInst_*,_std::default_delete<mir::inst::AssignInst>_>)
            0x0;
  std::
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
            ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              *)&this->init_inst_after,
             (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)&destId_1);
  if (destId_1.super_Displayable._vptr_Displayable != (_func_int **)0x0) {
    (**(code **)(*destId_1.super_Displayable._vptr_Displayable + 0x28))();
  }
  destId_1.super_Displayable._vptr_Displayable = (_func_int **)0x0;
  std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::~unique_ptr
            ((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_> *)
             &new_id);
  for (p_Var14 = (subfunc->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var14 != &(subfunc->variables)._M_t._M_impl.super__Rb_tree_header;
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
    destId_1.super_Displayable._vptr_Displayable._0_4_ = p_Var14[1]._M_color;
    sVar12 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::count
                       (pmVar2,(key_type *)&destId_1);
    if (sVar12 == 0) {
      iVar16 = local_a0->varId + 1;
      local_a0->varId = iVar16;
      new_id = iVar16;
      destId_1.super_Displayable._vptr_Displayable._0_4_ = p_Var14[1]._M_color;
      pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](pmVar2,(key_type *)&destId_1);
      *pmVar13 = iVar16;
      pmVar10 = std::
                map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                ::at(this_01,&p_Var14[1]._M_color);
      destId_1.super_Displayable._vptr_Displayable._0_4_ = new_id;
      mir::inst::Variable::Variable((Variable *)&destId_1.id,pmVar10);
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
      ::_M_emplace_unique<std::pair<unsigned_int,mir::inst::Variable>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
                  *)this_00,(pair<unsigned_int,_mir::inst::Variable> *)&destId_1);
      mir::inst::Variable::~Variable((Variable *)&destId_1.id);
      iVar16 = local_a0->Inline_Var_Priority;
      pmVar10 = std::
                map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                ::operator[](this_00,&new_id);
      pmVar10->priority = iVar16;
    }
  }
  p_Var1 = &(subfunc->basic_blks)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var14 = (subfunc->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var14 != p_Var1; p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
    iVar16 = local_a0->labelId + 1;
    local_a0->labelId = iVar16;
    sVar12 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::count
                       (local_a8,(key_type *)(p_Var14 + 1));
    if (sVar12 == 0) {
      pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](local_a8,(key_type *)(p_Var14 + 1));
      *pmVar13 = iVar16;
    }
  }
  lVar7 = std::_Rb_tree_decrement(&p_Var1->_M_header);
  pmVar2 = local_a8;
  pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                      (local_a8,(key_type *)
                                ((subfunc->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_left + 1));
  pRVar5 = local_a0;
  local_a0->sub_starttId = *pmVar13;
  pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                      (pmVar2,(key_type *)(lVar7 + 0x20));
  pRVar5->sub_endId = *pmVar13;
  return;
}

Assistant:

Rewriter(mir::inst::MirFunction& func, mir::inst::MirFunction& subfunc,
           mir::inst::CallInst& callInst, int cur_blkId)
      : func(func), subfunc(subfunc), cur_blkId(cur_blkId) {
    auto var_end_iter = func.variables.end();
    var_end_iter--;
    while (var_end_iter->first > 1000000) {
      var_end_iter--;
    }
    varId = var_end_iter->first;
    auto label_end_iter = func.basic_blks.end();
    label_end_iter--;
    label_end_iter--;
    labelId = label_end_iter->first;
    for (int i = 0; i < callInst.params.size(); i++) {
      int para = i + 1;
      if (callInst.params[i].index() == 0) {
        auto imm = std::get<int>(callInst.params[i]);
        auto destId = get_new_varId();
        func.variables[destId] = subfunc.variables.at(para);
        func.variables[destId].priority = Inline_Var_Priority;
        init_inst_before.push_back(
            std::make_unique<mir::inst::AssignInst>(destId, imm));
        var_cast_map[para] = destId.id;
      } else {
        auto para_varId = std::get<mir::inst::VarId>(callInst.params[i]);
        var_cast_map[para] = para_varId.id;
      }
    }
    int ret = 0;
    auto destId = get_new_varId();
    var_cast_map[ret] = destId.id;
    if (subfunc.variables.count(ret)) {
      func.variables[destId.id] = subfunc.variables.at(ret);
    } else {
      func.variables[destId.id] = func.variables.at(callInst.dest.id);
    }
    init_inst_after.push_back(
        std::make_unique<mir::inst::AssignInst>(callInst.dest, destId));
    for (auto iter = subfunc.variables.begin(); iter != subfunc.variables.end();
         ++iter) {
      if (!var_cast_map.count(iter->first)) {
        auto new_id = get_new_varId().id;
        var_cast_map[iter->first] = new_id;
        func.variables.insert(
            std::make_pair(new_id, subfunc.variables.at(iter->first)));
        func.variables[new_id].priority = Inline_Var_Priority;
      }
    }
    for (auto iter = subfunc.basic_blks.begin();
         iter != subfunc.basic_blks.end(); ++iter) {
      int new_id;

      new_id = get_new_labelId();
      if (!label_cast_map.count(iter->first)) {
        label_cast_map[iter->first] = new_id;
      }
    }
    auto iter = subfunc.basic_blks.end();
    iter--;
    sub_starttId = label_cast_map.at(subfunc.basic_blks.begin()->first);
    sub_endId = label_cast_map.at(iter->first);
  }